

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

int map_goto(int state,int symbol)

{
  int iVar1;
  int s;
  int middle;
  int low;
  int high;
  int symbol_local;
  int state_local;
  
  s = goto_map[symbol];
  middle = goto_map[symbol + 1];
  while( true ) {
    if (middle < s) {
      __assert_fail("low <= high",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChrisDodd[P]btyacc/lalr.c",
                    0xf4,"int map_goto(int, int)");
    }
    iVar1 = s + middle >> 1;
    if (from_state[iVar1] == state) break;
    if (from_state[iVar1] < state) {
      s = iVar1 + 1;
    }
    else {
      middle = iVar1 + -1;
    }
  }
  return iVar1;
}

Assistant:

int map_goto(int state, int symbol)
{
    register int high;
    register int low;
    register int middle;
    register int s;

    low = goto_map[symbol];
    high = goto_map[symbol + 1];

    for (;;)
    {
	assert(low <= high);
	middle = (low + high) >> 1;
	s = from_state[middle];
	if (s == state)
	    return (middle);
	else if (s < state)
	    low = middle + 1;
	else
	    high = middle - 1;
    }
}